

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O2

void StoreTrivialContextMap
               (EncodeContextMapArena *arena,size_t num_types,size_t context_bits,HuffmanTree *tree,
               size_t *storage_ix,uint8_t *storage)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  ulong histogram_length;
  
  StoreVarLenUint8(num_types - 1,storage_ix,storage);
  if (1 < num_types) {
    lVar1 = context_bits - 1;
    histogram_length = (num_types + context_bits) - 1;
    switchD_014c3389::default(arena,0,histogram_length * 4);
    uVar3 = *storage_ix;
    *(ulong *)(storage + (uVar3 >> 3)) = (ulong)storage[uVar3 >> 3] | 1L << ((byte)uVar3 & 7);
    uVar4 = uVar3 + 1;
    *storage_ix = uVar4;
    *(size_t *)(storage + (uVar4 >> 3)) =
         context_bits - 2 << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
    *storage_ix = uVar3 + 5;
    arena->histogram[context_bits - 1] = (uint32_t)num_types;
    arena->histogram[0] = 1;
    for (sVar5 = context_bits; sVar5 < histogram_length; sVar5 = sVar5 + 1) {
      arena->histogram[sVar5] = 1;
    }
    BuildAndStoreHuffmanTree
              (arena->histogram,histogram_length,histogram_length,tree,arena->depths,arena->bits,
               storage_ix,storage);
    for (sVar5 = 0; num_types != sVar5; sVar5 = sVar5 + 1) {
      lVar2 = lVar1 + sVar5;
      if (sVar5 == 0) {
        lVar2 = 0;
      }
      uVar4 = *storage_ix;
      uVar3 = arena->depths[lVar2] + uVar4;
      *(ulong *)(storage + (uVar4 >> 3)) =
           (ulong)arena->bits[lVar2] << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
      *storage_ix = uVar3;
      uVar4 = arena->depths[context_bits - 1] + uVar3;
      *(ulong *)(storage + (uVar3 >> 3)) =
           (ulong)arena->bits[context_bits - 1] << ((byte)uVar3 & 7) | (ulong)storage[uVar3 >> 3];
      *storage_ix = uVar4;
      *(ulong *)(storage + (uVar4 >> 3)) =
           (ulong)(uint)~(-1 << ((byte)lVar1 & 0x1f)) << ((byte)uVar4 & 7) |
           (ulong)storage[uVar4 >> 3];
      *storage_ix = uVar4 + lVar1;
    }
    uVar4 = *storage_ix;
    *(ulong *)(storage + (uVar4 >> 3)) = (ulong)storage[uVar4 >> 3] | 1L << ((byte)uVar4 & 7);
    *storage_ix = uVar4 + 1;
  }
  return;
}

Assistant:

static void StoreTrivialContextMap(EncodeContextMapArena* arena,
                                   size_t num_types,
                                   size_t context_bits,
                                   HuffmanTree* tree,
                                   size_t* storage_ix,
                                   uint8_t* storage) {
  StoreVarLenUint8(num_types - 1, storage_ix, storage);
  if (num_types > 1) {
    size_t repeat_code = context_bits - 1u;
    size_t repeat_bits = (1u << repeat_code) - 1u;
    size_t alphabet_size = num_types + repeat_code;
    uint32_t* BROTLI_RESTRICT const histogram = arena->histogram;
    uint8_t* BROTLI_RESTRICT const depths = arena->depths;
    uint16_t* BROTLI_RESTRICT const bits = arena->bits;
    size_t i;
    memset(histogram, 0, alphabet_size * sizeof(histogram[0]));
    /* Write RLEMAX. */
    BrotliWriteBits(1, 1, storage_ix, storage);
    BrotliWriteBits(4, repeat_code - 1, storage_ix, storage);
    histogram[repeat_code] = (uint32_t)num_types;
    histogram[0] = 1;
    for (i = context_bits; i < alphabet_size; ++i) {
      histogram[i] = 1;
    }
    BuildAndStoreHuffmanTree(histogram, alphabet_size, alphabet_size,
                             tree, depths, bits, storage_ix, storage);
    for (i = 0; i < num_types; ++i) {
      size_t code = (i == 0 ? 0 : i + context_bits - 1);
      BrotliWriteBits(depths[code], bits[code], storage_ix, storage);
      BrotliWriteBits(
          depths[repeat_code], bits[repeat_code], storage_ix, storage);
      BrotliWriteBits(repeat_code, repeat_bits, storage_ix, storage);
    }
    /* Write IMTF (inverse-move-to-front) bit. */
    BrotliWriteBits(1, 1, storage_ix, storage);
  }
}